

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeParseCellPtr(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  u8 *puVar5;
  u8 *puVar6;
  uint uVar7;
  u16 uVar8;
  u8 *pIter;
  ulong uVar9;
  long lVar10;
  
  bVar1 = *pCell;
  uVar7 = (uint)bVar1;
  puVar5 = pCell;
  if ((char)bVar1 < '\0') {
    uVar7 = bVar1 & 0x7f;
    uVar9 = 0;
    do {
      lVar10 = uVar9 + 1;
      uVar4 = uVar9 + 1;
      uVar7 = pCell[lVar10] & 0x7f | uVar7 << 7;
      if (6 < uVar9) break;
      uVar9 = uVar4;
    } while ((char)pCell[lVar10] < '\0');
    puVar5 = pCell + uVar4;
  }
  bVar1 = puVar5[1];
  uVar9 = (ulong)bVar1;
  if ((char)bVar1 < '\0') {
    uVar9 = (ulong)(bVar1 & 0x7f);
    lVar10 = 0;
    do {
      uVar9 = (ulong)(puVar5[lVar10 + 2] & 0x7f) | uVar9 << 7;
      if (-1 < (char)puVar5[lVar10 + 2]) {
        puVar6 = puVar5 + lVar10 + 2;
        goto LAB_00225713;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 7);
    puVar6 = puVar5 + 9;
    uVar9 = uVar9 << 8 | (ulong)puVar5[9];
  }
  else {
    puVar6 = puVar5 + 1;
  }
LAB_00225713:
  pInfo->nKey = uVar9;
  pInfo->nPayload = uVar7;
  pInfo->pPayload = puVar6 + 1;
  if (pPage->maxLocal < uVar7) {
    uVar2 = pPage->minLocal;
    uVar7 = (pInfo->nPayload - (uint)uVar2) % (pPage->pBt->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)pPage->maxLocal < (int)uVar7) {
      uVar7 = (uint)uVar2;
    }
    pInfo->nLocal = (u16)uVar7;
    pInfo->nSize = (((u16)uVar7 + (short)*(undefined4 *)&pInfo->pPayload) - (short)pCell) + 4;
    return;
  }
  uVar3 = ((int)(puVar6 + 1) - (int)pCell) + uVar7;
  uVar8 = 4;
  if ((uVar3 & 0xfffc) != 0) {
    uVar8 = (u16)uVar3;
  }
  pInfo->nSize = uVar8;
  pInfo->nLocal = (u16)uVar7;
  return;
}

Assistant:

static void btreeParseCellPtr(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */
  u64 iKey;               /* Extracted Key value */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  assert( pPage->intKeyLeaf );
  assert( pPage->childPtrSize==0 );
  pIter = pCell;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint32(pIter, nPayload);
  **
  ** The code is inlined to avoid a function call.
  */
  nPayload = *pIter;
  if( nPayload>=0x80 ){
    u8 *pEnd = &pIter[8];
    nPayload &= 0x7f;
    do{
      nPayload = (nPayload<<7) | (*++pIter & 0x7f);
    }while( (*pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint(pIter, (u64*)&pInfo->nKey);
  **
  ** The code is inlined to avoid a function call.
  */
  iKey = *pIter;
  if( iKey>=0x80 ){
    u8 *pEnd = &pIter[7];
    iKey &= 0x7f;
    while(1){
      iKey = (iKey<<7) | (*++pIter & 0x7f);
      if( (*pIter)<0x80 ) break;
      if( pIter>=pEnd ){
        iKey = (iKey<<8) | *++pIter;
        break;
      }
    }
  }
  pIter++;

  pInfo->nKey = *(i64*)&iKey;
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
  }else{
    btreeParseCellAdjustSizeForOverflow(pPage, pCell, pInfo);
  }
}